

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

int32 best_rem_score(ps_astar_t *nbest,ps_latnode_t *from)

{
  int32 iVar1;
  int iVar2;
  int iVar3;
  latlink_list_t *plVar4;
  int32 n_used;
  int32 local_34;
  
  iVar2 = (from->info).fanin;
  if (0 < iVar2) {
    plVar4 = from->exits;
    if (plVar4 == (latlink_list_t *)0x0) {
      iVar2 = -0x20000000;
    }
    else {
      iVar2 = -0x20000000;
      do {
        iVar1 = best_rem_score(nbest,plVar4->link->to);
        iVar3 = iVar1 + plVar4->link->ascr;
        if (nbest->lmset != (ngram_model_t *)0x0) {
          iVar1 = ngram_bg_score(nbest->lmset,plVar4->link->to->basewid,from->basewid,&local_34);
          iVar3 = (int)((float)(iVar1 >> 10) * (float)nbest->lwf + (float)iVar3);
        }
        if (iVar2 < iVar3) {
          iVar2 = iVar3;
        }
        plVar4 = plVar4->next;
      } while (plVar4 != (latlink_list_s *)0x0);
    }
    (from->info).fanin = iVar2;
  }
  return iVar2;
}

Assistant:

static int32
best_rem_score(ps_astar_t *nbest, ps_latnode_t * from)
{
    latlink_list_t *x;
    int32 bestscore, score;

    if (from->info.rem_score <= 0)
        return (from->info.rem_score);

    /* Best score from "from" to end of utt not known; compute from successors */
    bestscore = WORST_SCORE;
    for (x = from->exits; x; x = x->next) {
        int32 n_used;

        score = best_rem_score(nbest, x->link->to);
        score += x->link->ascr;
        if (nbest->lmset)
            score += (ngram_bg_score(nbest->lmset, x->link->to->basewid,
                                     from->basewid, &n_used) >> SENSCR_SHIFT)
                      * nbest->lwf;
        if (score BETTER_THAN bestscore)
            bestscore = score;
    }
    from->info.rem_score = bestscore;

    return bestscore;
}